

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O2

Image * GenImageGradientRadial
                  (Image *__return_storage_ptr__,int width,int height,float density,Color inner,
                  Color outer)

{
  char cVar1;
  short sVar5;
  short sVar6;
  short sVar7;
  undefined1 auVar8 [14];
  undefined1 auVar9 [12];
  unkuint10 Var10;
  undefined1 auVar11 [12];
  undefined1 auVar12 [14];
  undefined1 auVar13 [12];
  undefined1 auVar14 [12];
  undefined1 auVar15 [13];
  undefined1 auVar16 [11];
  undefined1 auVar17 [13];
  undefined1 auVar18 [11];
  undefined1 auVar19 [14];
  undefined1 auVar20 [14];
  uint6 uVar21;
  uint6 uVar22;
  void *pvVar23;
  int iVar24;
  ulong uVar25;
  void *pvVar26;
  ulong uVar27;
  ulong uVar28;
  int x;
  ulong uVar29;
  short sVar30;
  float fVar31;
  undefined1 auVar34 [16];
  float fVar35;
  ushort uVar38;
  ushort uVar39;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  char cVar2;
  char cVar3;
  char cVar4;
  undefined4 uVar32;
  undefined6 uVar33;
  
  pvVar23 = malloc((long)(height * width) << 2);
  iVar24 = height;
  if (width < height) {
    iVar24 = width;
  }
  Var10 = CONCAT91((unkuint9)0 << 8,outer.a);
  auVar16[10] = 0;
  auVar16._0_10_ = Var10;
  auVar9._1_11_ = auVar16 << 8;
  auVar9[0] = outer.b;
  auVar15[0xc] = 0;
  auVar15._0_12_ = auVar9;
  auVar8._1_13_ = auVar15 << 8;
  auVar8[0] = outer.g;
  auVar36._0_2_ = CONCAT11(0,outer.r);
  auVar36._2_14_ = auVar8;
  uVar38 = (ushort)Var10;
  auVar19._10_2_ = 0;
  auVar19._0_10_ = auVar36._0_10_;
  auVar19._12_2_ = uVar38;
  uVar21 = CONCAT42(auVar19._10_4_,auVar9._0_2_);
  auVar11._2_10_ = (unkuint10)uVar21 << 0x10;
  auVar11._0_2_ = auVar8._0_2_;
  Var10 = CONCAT91((unkuint9)0 << 8,inner.a);
  auVar18[10] = 0;
  auVar18._0_10_ = Var10;
  auVar13._1_11_ = auVar18 << 8;
  auVar13[0] = inner.b;
  auVar17[0xc] = 0;
  auVar17._0_12_ = auVar13;
  auVar12._1_13_ = auVar17 << 8;
  auVar12[0] = inner.g;
  auVar37._0_2_ = CONCAT11(0,inner.r);
  auVar37._2_14_ = auVar12;
  uVar39 = (ushort)Var10;
  auVar20._10_2_ = 0;
  auVar20._0_10_ = auVar37._0_10_;
  auVar20._12_2_ = uVar39;
  uVar22 = CONCAT42(auVar20._10_4_,auVar13._0_2_);
  auVar14._2_10_ = (unkuint10)uVar22 << 0x10;
  auVar14._0_2_ = auVar12._0_2_;
  uVar27 = 0;
  uVar28 = 0;
  if (0 < width) {
    uVar28 = (ulong)(uint)width;
  }
  uVar25 = 0;
  if (0 < height) {
    uVar25 = (ulong)(uint)height;
  }
  pvVar26 = pvVar23;
  for (; uVar27 != uVar25; uVar27 = uVar27 + 1) {
    for (uVar29 = 0; uVar28 != uVar29; uVar29 = uVar29 + 1) {
      fVar31 = hypotf((float)(int)uVar29 - (float)width * 0.5,
                      (float)(int)uVar27 - (float)height * 0.5);
      fVar31 = (fVar31 + -((float)iVar24 * 0.5) * density) / ((1.0 - density) * (float)iVar24 * 0.5)
      ;
      if (fVar31 <= 0.0) {
        fVar31 = 0.0;
      }
      if (1.0 <= fVar31) {
        fVar31 = 1.0;
      }
      fVar35 = 1.0 - fVar31;
      auVar34._0_4_ = (int)(fVar31 * (float)auVar36._0_2_ + fVar35 * (float)auVar37._0_2_);
      auVar34._4_4_ = (int)(fVar31 * (float)auVar11._0_4_ + fVar35 * (float)auVar14._0_4_);
      auVar34._8_4_ = (int)(fVar31 * (float)(int)uVar21 + fVar35 * (float)(int)uVar22);
      auVar34._12_4_ = (int)(fVar31 * (float)uVar38 + fVar35 * (float)uVar39);
      auVar34 = auVar34 & _DAT_00154940;
      sVar5 = auVar34._0_2_;
      cVar1 = (0 < sVar5) * (sVar5 < 0x100) * auVar34[0] - (0xff < sVar5);
      sVar5 = auVar34._2_2_;
      sVar30 = CONCAT11((0 < sVar5) * (sVar5 < 0x100) * auVar34[2] - (0xff < sVar5),cVar1);
      sVar5 = auVar34._4_2_;
      cVar2 = (0 < sVar5) * (sVar5 < 0x100) * auVar34[4] - (0xff < sVar5);
      sVar5 = auVar34._6_2_;
      uVar32 = CONCAT13((0 < sVar5) * (sVar5 < 0x100) * auVar34[6] - (0xff < sVar5),
                        CONCAT12(cVar2,sVar30));
      sVar5 = auVar34._8_2_;
      cVar3 = (0 < sVar5) * (sVar5 < 0x100) * auVar34[8] - (0xff < sVar5);
      sVar5 = auVar34._10_2_;
      uVar33 = CONCAT15((0 < sVar5) * (sVar5 < 0x100) * auVar34[10] - (0xff < sVar5),
                        CONCAT14(cVar3,uVar32));
      sVar5 = auVar34._12_2_;
      cVar4 = (0 < sVar5) * (sVar5 < 0x100) * auVar34[0xc] - (0xff < sVar5);
      sVar7 = auVar34._14_2_;
      sVar5 = (short)((uint)uVar32 >> 0x10);
      sVar6 = (short)((uint6)uVar33 >> 0x20);
      sVar7 = (short)(CONCAT17((0 < sVar7) * (sVar7 < 0x100) * auVar34[0xe] - (0xff < sVar7),
                               CONCAT16(cVar4,uVar33)) >> 0x30);
      *(uint *)((long)pvVar26 + uVar29 * 4) =
           CONCAT13((0 < sVar7) * (sVar7 < 0x100) * cVar4 - (0xff < sVar7),
                    CONCAT12((0 < sVar6) * (sVar6 < 0x100) * cVar3 - (0xff < sVar6),
                             CONCAT11((0 < sVar5) * (sVar5 < 0x100) * cVar2 - (0xff < sVar5),
                                      (0 < sVar30) * (sVar30 < 0x100) * cVar1 - (0xff < sVar30))));
    }
    pvVar26 = (void *)((long)pvVar26 + (long)width * 4);
  }
  __return_storage_ptr__->data = pvVar23;
  __return_storage_ptr__->width = width;
  __return_storage_ptr__->height = height;
  __return_storage_ptr__->mipmaps = 1;
  __return_storage_ptr__->format = 7;
  return __return_storage_ptr__;
}

Assistant:

Image GenImageGradientRadial(int width, int height, float density, Color inner, Color outer)
{
    Color *pixels = (Color *)RL_MALLOC(width*height*sizeof(Color));
    float radius = (width < height)? (float)width/2.0f : (float)height/2.0f;

    float centerX = (float)width/2.0f;
    float centerY = (float)height/2.0f;

    for (int y = 0; y < height; y++)
    {
        for (int x = 0; x < width; x++)
        {
            float dist = hypotf((float)x - centerX, (float)y - centerY);
            float factor = (dist - radius*density)/(radius*(1.0f - density));

            factor = (float)fmax(factor, 0.0f);
            factor = (float)fmin(factor, 1.f); // dist can be bigger than radius so we have to check

            pixels[y*width + x].r = (int)((float)outer.r*factor + (float)inner.r*(1.0f - factor));
            pixels[y*width + x].g = (int)((float)outer.g*factor + (float)inner.g*(1.0f - factor));
            pixels[y*width + x].b = (int)((float)outer.b*factor + (float)inner.b*(1.0f - factor));
            pixels[y*width + x].a = (int)((float)outer.a*factor + (float)inner.a*(1.0f - factor));
        }
    }

    Image image = {
        .data = pixels,
        .width = width,
        .height = height,
        .format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8,
        .mipmaps = 1
    };

    return image;
}